

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnncheck.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  rnndb *db;
  
  rnn_init();
  if (1 < argc) {
    db = rnn_newdb();
    rnn_parsefile(db,argv[1]);
    rnn_prepdb(db);
    iVar1 = db->estatus;
    rnn_freedb(db);
    rnn_fini();
    return iVar1;
  }
  puts("Usage:\n\trnncheck file.xml");
  exit(2);
}

Assistant:

int main(int argc, char **argv) {
	int ret;
	rnn_init();
	if (argc < 2) {
		usage();
	}
	struct rnndb *db = rnn_newdb();
	rnn_parsefile (db, argv[1]);
	rnn_prepdb (db);

	ret = db->estatus;
	rnn_freedb(db);
	rnn_fini();
	return ret;
}